

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HArray.hpp
# Opt level: O1

void __thiscall
Qentem::HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
          (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *this,
          HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *src)

{
  SizeT *pSVar1;
  uint uVar2;
  uint uVar3;
  SizeT *pSVar4;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar5;
  SizeT SVar6;
  ulong uVar7;
  SizeT SVar8;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *src_00;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar9;
  SizeT *index;
  SizeT *local_50;
  String<char16_t> local_48;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *local_38;
  
  uVar2 = (src->
          super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ).index_;
  SVar8 = (this->
          super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ).index_ + uVar2;
  src_00 = (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
           ((src->
            super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
            ).hashTable_ +
           (src->
           super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           ).capacity_);
  if ((this->
      super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
      ).capacity_ < SVar8) {
    HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
    ::resize(&this->
              super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
             ,SVar8);
  }
  if (uVar2 != 0) {
    pHVar9 = src_00 + uVar2;
    local_38 = pHVar9;
    do {
      if (src_00->Hash != 0) {
        pHVar5 = HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                 ::find(&this->
                         super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                        ,&local_50,(src_00->Key).storage_,(src_00->Key).length_,src_00->Hash);
        pSVar1 = local_50;
        if (pHVar5 == (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)0x0) {
          String<char16_t>::String(&local_48,&src_00->Key);
          SVar8 = src_00->Hash;
          uVar2 = (this->
                  super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                  ).index_;
          uVar7 = (ulong)uVar2;
          uVar3 = (this->
                  super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                  ).capacity_;
          pSVar4 = (this->
                   super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
                   ).hashTable_;
          pHVar5 = (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                   (pSVar4 + (ulong)uVar3 + uVar7 * 0xc);
          SVar6 = uVar2 + 1;
          (this->
          super_HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
          ).index_ = SVar6;
          *pSVar1 = SVar6;
          pSVar4[(ulong)uVar3 + uVar7 * 0xc + 4] = SVar8;
          pSVar4[(ulong)uVar3 + uVar7 * 0xc + 5] = 0;
          *(char16_t **)(pSVar4 + (ulong)uVar3 + uVar7 * 0xc) = local_48.storage_;
          pSVar4[(ulong)uVar3 + uVar7 * 0xc + 2] = local_48.length_;
          local_48.length_ = 0;
          local_48.storage_ = (char16_t *)0x0;
          operator_delete((void *)0x0);
          pSVar1 = pSVar4 + (ulong)uVar3 + uVar7 * 0xc + 6;
          pSVar1[0] = 0;
          pSVar1[1] = 0;
          pSVar1[2] = 0;
          pSVar1[3] = 0;
          *(undefined1 *)(pSVar4 + (ulong)uVar3 + uVar7 * 0xc + 10) = 0;
          pHVar9 = local_38;
        }
        if (src_00 != pHVar5) {
          Value<char16_t>::reset(&pHVar5->Value);
          Value<char16_t>::copyValue(&pHVar5->Value,&src_00->Value);
        }
      }
      src_00 = src_00 + 1;
    } while (src_00 < pHVar9);
  }
  return;
}

Assistant:

void operator+=(const HArray &src) {
        const SizeT  n_size   = (Size() + src.Size());
        const HItem *src_item = src.First();
        const HItem *src_end  = src_item + src.Size();

        if (n_size > Capacity()) {
            resize(n_size);
        }

        while (src_item < src_end) {
            if (src_item->Hash != 0) {
                SizeT *index;
                HItem *storage_item = find(index, src_item->Key.First(), src_item->Key.Length(), src_item->Hash);

                if (storage_item == nullptr) {
                    storage_item = insert(index, Key_T{src_item->Key}, src_item->Hash);
                    Memory::Initialize(&(storage_item->Value));
                }

                storage_item->Value = src_item->Value;
            }

            ++src_item;
        }
    }